

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

void Gia_ManToBridgeAbsNetlistTest(char *pFileName,Gia_Man_t *p,int msg_type)

{
  FILE *__stream;
  FILE *pFile;
  int msg_type_local;
  Gia_Man_t *p_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    Gia_ManToBridgeAbsNetlist((FILE *)__stream,p,msg_type);
    fclose(__stream);
  }
  return;
}

Assistant:

void Gia_ManToBridgeAbsNetlistTest( char * pFileName, Gia_Man_t * p, int msg_type )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    Gia_ManToBridgeAbsNetlist( pFile, p, msg_type );
    fclose ( pFile );
}